

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

int uv_timer_again(uv_timer_t *handle)

{
  int iVar1;
  
  if (handle->timer_cb == (uv_timer_cb)0x0) {
    iVar1 = -0x16;
  }
  else {
    iVar1 = 0;
    if (handle->repeat != 0) {
      uv_timer_stop(handle);
      uv_timer_start(handle,handle->timer_cb,handle->repeat,handle->repeat);
    }
  }
  return iVar1;
}

Assistant:

int uv_timer_again(uv_timer_t* handle) {
  if (handle->timer_cb == NULL)
    return -EINVAL;

  if (handle->repeat) {
    uv_timer_stop(handle);
    uv_timer_start(handle, handle->timer_cb, handle->repeat, handle->repeat);
  }

  return 0;
}